

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * get_stem_contributions_d2
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  vrna_param_t *p;
  int *piVar4;
  int *piVar5;
  code *pcVar6;
  code *pcVar7;
  short *psVar8;
  char *pcVar9;
  vrna_sc_t *pvVar10;
  short **ppsVar11;
  uint **ppuVar12;
  uchar uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  void *__ptr;
  void *__ptr_00;
  int local_f8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int mm5;
  int *stems;
  int *c;
  int turn;
  int *indx;
  int ij;
  int i;
  int n;
  uint type;
  uint **a2s;
  uint n_seq;
  uint s;
  short *sj;
  short *s3j;
  short **S3;
  short **S5;
  short **SS;
  short *si1;
  short sj1;
  short *S;
  char *ptype;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar17 = (int *)vrna_alloc(j << 2);
  uVar15 = fc->length;
  p = fc->params;
  piVar4 = fc->jindx;
  piVar5 = (fc->matrices->field_2).field_0.c;
  uVar2 = (p->model_details).min_loop_size;
  indx._0_4_ = ~uVar2 + piVar4[j] + j;
  pcVar6 = (code *)sc_wrapper->decomp_stem;
  pcVar7 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar8 = (fc->field_23).field_0.sequence_encoding;
    pcVar9 = (fc->field_23).field_0.ptype;
    SS = (short **)(psVar8 + (long)j + (-2 - (long)(int)uVar2));
    if (j < (int)uVar15) {
      sVar1 = psVar8[j + 1];
    }
    else {
      sVar1 = -1;
    }
    iVar16 = j - uVar2;
    while (indx._4_4_ = iVar16 + -1, 1 < indx._4_4_) {
      piVar17[indx._4_4_] = 10000000;
      if ((piVar5[(int)indx] != 10000000) &&
         (uVar13 = (*evaluate)(1,j,iVar16 + -2,indx._4_4_,'\x12',hc_dat_local), uVar13 != '\0')) {
        uVar15 = vrna_get_ptype((int)indx,pcVar9);
        iVar16 = piVar5[(int)indx];
        iVar14 = vrna_E_ext_stem(uVar15,(int)*(short *)SS,(int)sVar1,p);
        piVar17[indx._4_4_] = iVar16 + iVar14;
      }
      indx._0_4_ = (int)indx + -1;
      SS = (short **)((long)SS + -2);
      iVar16 = indx._4_4_;
    }
    if (pcVar6 != (code *)0x0) {
      indx._4_4_ = j - uVar2;
      while (iVar16 = indx._4_4_, indx._4_4_ = iVar16 + -1, 1 < indx._4_4_) {
        if (piVar17[indx._4_4_] != 10000000) {
          iVar16 = (*pcVar6)(j,iVar16 + -2,indx._4_4_,sc_wrapper);
          piVar17[indx._4_4_] = iVar16 + piVar17[indx._4_4_];
        }
      }
    }
    piVar17[1] = 10000000;
    iVar16 = piVar4[j] + 1;
    if ((piVar5[iVar16] != 10000000) &&
       (uVar13 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar13 != '\0')) {
      uVar15 = vrna_get_ptype(iVar16,pcVar9);
      iVar16 = piVar5[iVar16];
      iVar14 = vrna_E_ext_stem(uVar15,-1,(int)sVar1,p);
      piVar17[1] = iVar16 + iVar14;
      if (pcVar7 != (code *)0x0) {
        iVar16 = (*pcVar7)(j,1,j,sc_wrapper);
        piVar17[1] = iVar16 + piVar17[1];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar3 = (fc->field_23).field_1.n_seq;
    pcVar9 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar10 = (fc->field_23).field_0.sc;
    ppsVar11 = (fc->field_23).field_1.S3;
    ppuVar12 = (fc->field_23).field_1.a2s;
    __ptr = vrna_alloc(uVar3 << 1);
    __ptr_00 = vrna_alloc(uVar3 << 1);
    for (a2s._4_4_ = 0; a2s._4_4_ < uVar3; a2s._4_4_ = a2s._4_4_ + 1) {
      if (ppuVar12[a2s._4_4_][j] < ppuVar12[a2s._4_4_][(int)uVar15]) {
        sVar1 = ppsVar11[a2s._4_4_][j];
      }
      else {
        sVar1 = -1;
      }
      *(short *)((long)__ptr + (ulong)a2s._4_4_ * 2) = sVar1;
      *(undefined2 *)((long)__ptr_00 + (ulong)a2s._4_4_ * 2) =
           *(undefined2 *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) + (long)j * 2);
    }
    iVar16 = j - uVar2;
    while (indx._4_4_ = iVar16 + -1, 1 < indx._4_4_) {
      piVar17[indx._4_4_] = 10000000;
      if ((piVar5[(int)indx] != 10000000) &&
         (uVar13 = (*evaluate)(1,j,iVar16 + -2,indx._4_4_,'\x12',hc_dat_local), uVar13 != '\0')) {
        piVar17[indx._4_4_] = piVar5[(int)indx];
        for (a2s._4_4_ = 0; a2s._4_4_ < uVar3; a2s._4_4_ = a2s._4_4_ + 1) {
          uVar15 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) +
                                                    (long)indx._4_4_ * 2),
                                     (int)*(short *)((long)__ptr_00 + (ulong)a2s._4_4_ * 2),
                                     &p->model_details);
          if (ppuVar12[a2s._4_4_][indx._4_4_] < 2) {
            local_f8 = -1;
          }
          else {
            local_f8 = (int)*(short *)(*(long *)(&pvVar10->type + (ulong)a2s._4_4_ * 2) +
                                      (long)indx._4_4_ * 2);
          }
          iVar16 = vrna_E_ext_stem(uVar15,local_f8,
                                   (int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),p);
          piVar17[indx._4_4_] = iVar16 + piVar17[indx._4_4_];
        }
      }
      indx._0_4_ = (int)indx + -1;
      iVar16 = indx._4_4_;
    }
    if (pcVar6 != (code *)0x0) {
      indx._4_4_ = j - uVar2;
      while (iVar16 = indx._4_4_, indx._4_4_ = iVar16 + -1, 1 < indx._4_4_) {
        if (piVar17[indx._4_4_] != 10000000) {
          iVar16 = (*pcVar6)(j,iVar16 + -2,indx._4_4_,sc_wrapper);
          piVar17[indx._4_4_] = iVar16 + piVar17[indx._4_4_];
        }
      }
    }
    piVar17[1] = 10000000;
    iVar16 = piVar4[j];
    if ((piVar5[iVar16 + 1] != 10000000) &&
       (uVar13 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar13 != '\0')) {
      piVar17[1] = piVar5[iVar16 + 1];
      for (a2s._4_4_ = 0; a2s._4_4_ < uVar3; a2s._4_4_ = a2s._4_4_ + 1) {
        uVar15 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar9 + (ulong)a2s._4_4_ * 8) + 2),
                                   (int)*(short *)((long)__ptr_00 + (ulong)a2s._4_4_ * 2),
                                   &p->model_details);
        iVar16 = vrna_E_ext_stem(uVar15,-1,(int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),p);
        piVar17[1] = iVar16 + piVar17[1];
      }
      if (pcVar7 != (code *)0x0) {
        iVar16 = (*pcVar7)(j,1,j,sc_wrapper);
        piVar17[1] = iVar16 + piVar17[1];
      }
    }
    free(__ptr);
    free(__ptr_00);
  }
  return piVar17;
}

Assistant:

int *
get_stem_contributions_d2(vrna_fold_compound_t      *fc,
                          int                       j,
                          vrna_callback_hc_evaluate *evaluate,
                          struct default_data       *hc_dat_local,
                          struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   *S, sj1, *si1, **SS, **S5, **S3, *s3j, *sj;
  unsigned int            s, n_seq, **a2s, type;
  int                     n, i, ij, *indx, turn, *c, *stems, mm5;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  n     = (int)fc->length;
  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn - 1;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S     = fc->sequence_encoding;
      ptype = fc->ptype;
      si1   = S + j - turn - 2;
      sj1   = (j < n) ? S[j + 1] : -1;

      for (i = j - turn - 1; i > 1; i--, ij--, si1--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  = c[ij] +
                      vrna_E_ext_stem(type, *si1, sj1, P);
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j] + 1;

      if ((c[ij] != INF) && (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  = c[ij] +
                    vrna_E_ext_stem(type, -1, sj1, P);

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      SS    = fc->S;
      S5    = fc->S5;
      S3    = fc->S3;
      a2s   = fc->a2s;

      /* pre-compute S3[s][j - 1] */
      s3j = (short *)vrna_alloc(sizeof(short) * n_seq);
      sj  = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s3j[s]  = (a2s[s][j] < a2s[s][n]) ? S3[s][j] : -1;
        sj[s]   = SS[s][j];
      }

      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];
          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(SS[s][i], sj[s], md);
            mm5       = (a2s[s][i] > 1) ? S5[s][i] : -1;
            stems[i]  += vrna_E_ext_stem(type, mm5, s3j[s], P);
          }
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j] + 1;

      if ((c[ij] != INF) && (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        stems[1] = c[ij];

        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(SS[s][1], sj[s], md);
          stems[1]  += vrna_E_ext_stem(type, -1, s3j[s], P);
        }

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
      }

      free(s3j);
      free(sj);

      break;
  }

  return stems;
}